

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

LY_ERR lyd_insert_check_schema(lysc_node *parent,lysc_node *sibling,lysc_node *schema)

{
  lysc_node *plVar1;
  LY_ERR LVar2;
  LY_ERR LVar3;
  
  if ((parent != (lysc_node *)0x0) && ((parent->nodetype & 0x82) != 0)) {
    __assert_fail("!parent || !(parent->nodetype & (LYS_CASE | LYS_CHOICE))",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,1000,
                  "LY_ERR lyd_insert_check_schema(const struct lysc_node *, const struct lysc_node *, const struct lysc_node *)"
                 );
  }
  if ((sibling != (lysc_node *)0x0) && ((sibling->nodetype & 0x82) != 0)) {
    __assert_fail("!sibling || !(sibling->nodetype & (LYS_CASE | LYS_CHOICE))",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0x3e9,
                  "LY_ERR lyd_insert_check_schema(const struct lysc_node *, const struct lysc_node *, const struct lysc_node *)"
                 );
  }
  LVar2 = LY_SUCCESS;
  LVar3 = LY_SUCCESS;
  if (schema != (lysc_node *)0x0) {
    if ((schema->nodetype & 0x82) != 0) {
      __assert_fail("!schema || !(schema->nodetype & (LYS_CASE | LYS_CHOICE))",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                    ,0x3ea,
                    "LY_ERR lyd_insert_check_schema(const struct lysc_node *, const struct lysc_node *, const struct lysc_node *)"
                   );
    }
    LVar3 = LVar2;
    if (parent != (lysc_node *)0x0 || sibling != (lysc_node *)0x0) {
      if (parent == (lysc_node *)0x0) {
        if (sibling == (lysc_node *)0x0) {
          plVar1 = (lysc_node *)0x0;
        }
        else {
          plVar1 = sibling->parent;
        }
        parent = lysc_data_node(plVar1);
      }
      plVar1 = lysc_data_node(schema->parent);
      if (parent == (lysc_node *)0x0) {
        if (plVar1 != (lysc_node *)0x0) {
          LVar3 = LY_EINVAL;
          ly_log(schema->module->ctx,LY_LLERR,LY_EINVAL,
                 "Cannot insert, node \"%s\" is not top-level.",schema->name);
        }
      }
      else if (plVar1 != parent) {
        ly_log(schema->module->ctx,LY_LLERR,LY_EINVAL,
               "Cannot insert, parent of \"%s\" is not \"%s\".",schema->name,parent->name);
        LVar3 = LY_EINVAL;
      }
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
lyd_insert_check_schema(const struct lysc_node *parent, const struct lysc_node *sibling, const struct lysc_node *schema)
{
    const struct lysc_node *par2;

    assert(!parent || !(parent->nodetype & (LYS_CASE | LYS_CHOICE)));
    assert(!sibling || !(sibling->nodetype & (LYS_CASE | LYS_CHOICE)));
    assert(!schema || !(schema->nodetype & (LYS_CASE | LYS_CHOICE)));

    if (!schema || (!parent && !sibling)) {
        /* opaque nodes can be inserted wherever */
        return LY_SUCCESS;
    }

    if (!parent) {
        parent = lysc_data_parent(sibling);
    }

    /* find schema parent */
    par2 = lysc_data_parent(schema);

    if (parent) {
        /* inner node */
        if (par2 != parent) {
            LOGERR(schema->module->ctx, LY_EINVAL, "Cannot insert, parent of \"%s\" is not \"%s\".", schema->name,
                    parent->name);
            return LY_EINVAL;
        }
    } else {
        /* top-level node */
        if (par2) {
            LOGERR(schema->module->ctx, LY_EINVAL, "Cannot insert, node \"%s\" is not top-level.", schema->name);
            return LY_EINVAL;
        }
    }

    return LY_SUCCESS;
}